

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O3

void swapBuffersEGL(_GLFWwindow *window)

{
  _GLFWwindow *p_Var1;
  
  p_Var1 = (_GLFWwindow *)_glfwPlatformGetTls(&_glfw.contextSlot);
  if (p_Var1 != window) {
    _glfwInputError(0x10008,
                    "EGL: The context must be current on the calling thread when swapping buffers");
    return;
  }
  (*_glfw.egl.SwapBuffers)(_glfw.egl.display,(window->context).egl.surface);
  return;
}

Assistant:

static void swapBuffersEGL(_GLFWwindow* window)
{
    if (window != _glfwPlatformGetTls(&_glfw.contextSlot))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "EGL: The context must be current on the calling thread when swapping buffers");
        return;
    }

#if defined(_GLFW_WAYLAND)
    if (_glfw.platform.platformID == GLFW_PLATFORM_WAYLAND)
    {
        // NOTE: Swapping buffers on a hidden window on Wayland makes it visible
        if (!window->wl.visible)
            return;
    }
#endif

    eglSwapBuffers(_glfw.egl.display, window->context.egl.surface);
}